

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::removeNamedTarget(CoreBroker *this,ActionMessage *command)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  action_t aVar1;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  __sv_type _Var2;
  undefined1 in_stack_00000090 [16];
  undefined1 in_stack_000000a0 [16];
  string_view in_stack_000000d0;
  BasicHandleInfo *ept;
  BasicHandleInfo *filt;
  BasicHandleInfo *inp;
  BasicHandleInfo *pub;
  bool foundInterface;
  ActionMessage *in_stack_fffffffffffffe30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe38;
  ActionMessage *in_stack_fffffffffffffe48;
  CoreBroker *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  HandleManager *pHVar3;
  char *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  GlobalFederateId local_104;
  GlobalHandle local_100;
  string_view local_f8;
  BasicHandleInfo *local_e8;
  GlobalHandle local_e0;
  string_view local_d8;
  BasicHandleInfo *local_c8;
  GlobalHandle local_c0;
  string_view local_b8;
  BasicHandleInfo *local_a8;
  GlobalHandle local_a0;
  string_view local_98;
  BasicHandleInfo *local_88;
  byte local_79;
  CoreBroker *this_00;
  string_view in_stack_ffffffffffffff98;
  GlobalFederateId federateID;
  
  local_79 = 0;
  this_00 = in_RDI;
  aVar1 = ActionMessage::action(in_RSI);
  switch(aVar1) {
  case cmd_remove_named_input:
    local_b8 = ActionMessage::name((ActionMessage *)0x51e46c);
    name_00._M_str = in_stack_fffffffffffffe60;
    name_00._M_len = in_stack_fffffffffffffe58;
    local_a8 = HandleManager::getInterfaceHandle
                         ((HandleManager *)in_stack_fffffffffffffe50,name_00,
                          (InterfaceType)((ulong)in_stack_fffffffffffffe48 >> 0x38));
    if (local_a8 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(in_RSI,cmd_remove_publication);
      local_c0 = local_a8->handle;
      ActionMessage::setDestination(in_RSI,local_c0);
      SmallBuffer::clear(&in_RSI->payload);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      ActionMessage::setAction(in_RSI,cmd_remove_subscriber);
      ActionMessage::swapSourceDest(in_stack_fffffffffffffe30);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_79 = 1;
    }
    break;
  case cmd_remove_named_filter:
    pHVar3 = &in_RDI->handles;
    local_d8 = ActionMessage::name((ActionMessage *)0x51e56a);
    name_01._M_str = (char *)pHVar3;
    name_01._M_len = in_stack_fffffffffffffe58;
    local_c8 = HandleManager::getInterfaceHandle
                         ((HandleManager *)in_stack_fffffffffffffe50,name_01,
                          (InterfaceType)((ulong)in_stack_fffffffffffffe48 >> 0x38));
    if (local_c8 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(in_RSI,cmd_remove_endpoint);
      local_e0 = local_c8->handle;
      ActionMessage::setDestination(in_RSI,local_e0);
      SmallBuffer::clear(&in_RSI->payload);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      ActionMessage::setAction(in_RSI,cmd_remove_filter);
      ActionMessage::swapSourceDest(in_stack_fffffffffffffe30);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_79 = 1;
    }
    break;
  case cmd_remove_named_publication:
    local_98 = ActionMessage::name((ActionMessage *)0x51e36e);
    name._M_str = in_stack_fffffffffffffe60;
    name._M_len = in_stack_fffffffffffffe58;
    local_88 = HandleManager::getInterfaceHandle
                         ((HandleManager *)in_stack_fffffffffffffe50,name,
                          (InterfaceType)((ulong)in_stack_fffffffffffffe48 >> 0x38));
    if (local_88 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(in_RSI,cmd_remove_subscriber);
      local_a0 = local_88->handle;
      ActionMessage::setDestination(in_RSI,local_a0);
      SmallBuffer::clear(&in_RSI->payload);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      ActionMessage::setAction(in_RSI,cmd_remove_publication);
      ActionMessage::swapSourceDest(in_stack_fffffffffffffe30);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_79 = 1;
    }
    break;
  case cmd_remove_named_endpoint:
    pHVar3 = &in_RDI->handles;
    local_f8 = ActionMessage::name((ActionMessage *)0x51e668);
    name_02._M_str = in_stack_fffffffffffffe60;
    name_02._M_len = (size_t)pHVar3;
    local_e8 = HandleManager::getInterfaceHandle
                         ((HandleManager *)in_stack_fffffffffffffe50,name_02,
                          (InterfaceType)((ulong)in_stack_fffffffffffffe48 >> 0x38));
    if (local_e8 != (BasicHandleInfo *)0x0) {
      ActionMessage::setAction(in_RSI,cmd_remove_filter);
      local_100 = local_e8->handle;
      ActionMessage::setDestination(in_RSI,local_100);
      SmallBuffer::clear(&in_RSI->payload);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      ActionMessage::setAction(in_RSI,cmd_remove_endpoint);
      ActionMessage::swapSourceDest(in_stack_fffffffffffffe30);
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_79 = 1;
    }
  }
  if ((local_79 & 1) == 0) {
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
      routeMessage(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    else {
      GlobalFederateId::GlobalFederateId
                (&local_104,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      getIdentifier_abi_cxx11_(in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe30);
      ActionMessage::name((ActionMessage *)0x51e7e1);
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)&stack0xffffffffffffff98,in_stack_fffffffffffffe38);
      federateID.gid = 0;
      ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_000000a0,(format_args)in_stack_00000090);
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe30);
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    _Var2._M_str;
      BrokerBase::sendToLogger
                ((BrokerBase *)this_00,federateID,(int)((ulong)in_RSI >> 0x20),
                 in_stack_ffffffffffffff98,in_stack_000000d0,SUB81((ulong)in_RSI >> 0x18,0));
      std::__cxx11::string::~string(pbStack_120);
    }
  }
  return;
}

Assistant:

void CoreBroker::removeNamedTarget(ActionMessage& command)
{
    bool foundInterface = false;
    switch (command.action()) {
        case CMD_REMOVE_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.setDestination(pub->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                command.setAction(CMD_REMOVE_PUBLICATION);
                command.setDestination(inp->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_SUBSCRIBER);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_FILTER);
                command.swapSourceDest();
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_REMOVE_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                command.setAction(CMD_REMOVE_FILTER);
                command.setDestination(ept->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_REMOVE_ENDPOINT);
                command.swapSourceDest();
                routeMessage(command);

                foundInterface = true;
            }
        } break;
        default:
            break;
    }
    if (!foundInterface) {
        if (isRootc) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("attempt to remove unrecognized target {} ", command.name()));
        } else {
            routeMessage(command);
        }
    }
}